

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O3

wstring * __thiscall
cmsys::Encoding::ToWide_abi_cxx11_(wstring *__return_storage_ptr__,Encoding *this,char *cstr)

{
  wchar_t *pwVar1;
  pointer pwVar2;
  size_t sVar3;
  size_type __n;
  vector<wchar_t,_std::allocator<wchar_t>_> wchars;
  allocator_type local_39;
  vector<wchar_t,_std::allocator<wchar_t>_> local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  sVar3 = cmsysEncoding_mbstowcs((wchar_t *)0x0,(char *)this,0);
  __n = sVar3 + 1;
  if (__n != 0) {
    std::vector<wchar_t,_std::allocator<wchar_t>_>::vector(&local_38,__n,&local_39);
    sVar3 = cmsysEncoding_mbstowcs
                      (local_38.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                       super__Vector_impl_data._M_start,(char *)this,__n);
    pwVar2 = local_38.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (sVar3 != 0) {
      pwVar1 = (wchar_t *)__return_storage_ptr__->_M_string_length;
      wcslen(local_38.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
             super__Vector_impl_data._M_start);
      std::__cxx11::wstring::_M_replace((ulong)__return_storage_ptr__,0,pwVar1,(ulong)pwVar2);
    }
    if (local_38.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
        super__Vector_impl_data._M_start != (wchar_t *)0x0) {
      operator_delete(local_38.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring Encoding::ToWide(const char* cstr)
{
  std::wstring wstr;
  size_t length = kwsysEncoding_mbstowcs(0, cstr, 0) + 1;
  if (length > 0) {
    std::vector<wchar_t> wchars(length);
    if (kwsysEncoding_mbstowcs(&wchars[0], cstr, length) > 0) {
      wstr = &wchars[0];
    }
  }
  return wstr;
}